

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void __thiscall
ImStb::stb_textedit_find_charpos
          (ImStb *this,StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  ushort uVar2;
  long lVar3;
  ImFont *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  ImWchar *text_remaining;
  ImWchar *local_40;
  ImGuiInputTextState *local_38;
  
  fVar12 = find->y;
  local_38 = str;
  if (fVar12 == SUB84(str,0)) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar10 = 0;
      iVar7 = 0;
      if ((int)fVar12 < 1) {
        iVar11 = 0;
      }
      else {
        do {
          iVar11 = iVar7;
          local_40 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar11 * 2);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40,
                     (ImVec2 *)0x1,SUB41(single_line,0));
          iVar10 = iVar11 + (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
          iVar7 = iVar10;
        } while (iVar10 < (int)fVar12);
      }
      *(int *)(this + 0xc) = iVar10;
      *(undefined4 *)(this + 0x10) = 0;
      *(int *)(this + 0x14) = iVar11;
    }
    else {
      local_40 = (ImWchar *)0x0;
      IVar13 = InputTextCalcTextSizeW
                         (*(ImWchar **)(find + 1),*(ImWchar **)(find + 1) + (int)fVar12,&local_40,
                          (ImVec2 *)0x1,SUB41(single_line,0));
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(float *)(this + 0x10) = fVar12;
      *(float *)(this + 8) = IVar13.y;
      *(float *)this = IVar13.x;
    }
  }
  else {
    fVar12 = 0.0;
    iVar7 = 0;
    iVar10 = 0;
    while( true ) {
      iVar6 = iVar7;
      *(float *)(this + 4) = fVar12;
      local_40 = (ImWchar *)0x0;
      pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar6 * 2);
      IVar13 = InputTextCalcTextSizeW
                         (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40
                          ,(ImVec2 *)0x1,SUB41(single_line,0));
      iVar11 = (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
      iVar7 = iVar6 + iVar11;
      if ((int)local_38 < iVar7) break;
      fVar12 = IVar13.y + *(float *)(this + 4);
      iVar10 = iVar6;
    }
    *(int *)(this + 0xc) = iVar6;
    *(int *)(this + 0x10) = iVar11;
    *(float *)(this + 8) = IVar13.y;
    *(int *)(this + 0x14) = iVar10;
    *(undefined4 *)this = 0;
    pIVar5 = GImGui;
    if ((int)local_38 - iVar6 != 0 && iVar6 <= (int)local_38) {
      fVar12 = *(float *)this;
      lVar3 = *(long *)(find + 1);
      uVar8 = 0;
      do {
        uVar2 = *(ushort *)((long)iVar6 * 2 + lVar3 + uVar8 * 2);
        fVar14 = -1.0;
        if (uVar2 != 10) {
          pIVar4 = pIVar5->Font;
          pfVar9 = &pIVar4->FallbackAdvanceX;
          if ((int)(uint)uVar2 < (pIVar4->IndexAdvanceX).Size) {
            pfVar9 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar4->IndexAdvanceX).Data);
          }
          fVar14 = (pIVar5->FontSize / pIVar4->FontSize) * *pfVar9;
        }
        fVar12 = fVar12 + fVar14;
        *(float *)this = fVar12;
        uVar8 = uVar8 + 1;
      } while ((uint)((int)local_38 - iVar6) != uVar8);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}